

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManTune(If_DsdMan_t *p,int LutSize,int fFast,int fAdd,int fSpec,int fVerbose)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Int_t *p_00;
  ProgressBar *p_01;
  void *pvVar4;
  word *pTruth;
  char *pString;
  int iVar5;
  uint nVars;
  
  if (LutSize == 0 || fAdd == 0) {
    for (iVar5 = 0; iVar5 < (p->vObjs).nSize; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(&p->vObjs,iVar5);
      *(byte *)((long)pvVar3 + 5) = *(byte *)((long)pvVar3 + 5) & 0xfe;
    }
    if (LutSize == 0) {
      return;
    }
  }
  p_00 = Vec_IntAlloc(1000);
  pvVar3 = If_ManSatBuildXY(LutSize);
  p_01 = Extra_ProgressBarStart(_stdout,(p->vObjs).nSize);
  iVar5 = 0;
  do {
    if ((p->vObjs).nSize <= iVar5) {
      Extra_ProgressBarStop(p_01);
      If_ManSatUnbuild(pvVar3);
      Vec_IntFree(p_00);
      if (fVerbose == 0) {
        return;
      }
      If_DsdManPrintDistrib(p);
      return;
    }
    pvVar4 = Vec_PtrEntry(&p->vObjs,iVar5);
    Extra_ProgressBarUpdate(p_01,iVar5,pString);
    uVar2 = *(uint *)((long)pvVar4 + 4);
    nVars = uVar2 >> 3 & 0x1f;
    if ((LutSize < (int)nVars) && ((fAdd == 0 || ((uVar2 & 0x100) != 0)))) {
      *(uint *)((long)pvVar4 + 4) = uVar2 & 0xfffffeff;
      iVar1 = Abc_Var2Lit(iVar5,0);
      uVar2 = If_DsdManCheckXY_int(p,iVar1,LutSize,0,0,0);
      if (uVar2 == 0) {
        if (fFast == 0) {
          iVar1 = Abc_Var2Lit(iVar5,0);
          pTruth = If_DsdManComputeTruth(p,iVar1,(uchar *)0x0);
          uVar2 = If_ManSatCheckXYall(pvVar3,LutSize,pTruth,nVars,p_00);
          if (uVar2 != 0) goto LAB_00335df5;
        }
        If_DsdVecObjSetMark(&p->vObjs,iVar5);
      }
    }
LAB_00335df5:
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void If_DsdManTune( If_DsdMan_t * p, int LutSize, int fFast, int fAdd, int fSpec, int fVerbose )
{
    ProgressBar * pProgress = NULL;
    sat_solver * pSat = NULL;
    If_DsdObj_t * pObj;
    Vec_Int_t * vLits;
    int i, Value, nVars;
    word * pTruth;
    if ( !fAdd || !LutSize )
        If_DsdVecForEachObj( &p->vObjs, pObj, i )
            pObj->fMark = 0;
    if ( LutSize == 0 )
        return;
    vLits = Vec_IntAlloc( 1000 );
    pSat = (sat_solver *)If_ManSatBuildXY( LutSize );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        nVars = If_DsdObjSuppSize(pObj);
        if ( nVars <= LutSize )
            continue;
        if ( fAdd && !pObj->fMark )
            continue;
        pObj->fMark = 0;
        if ( If_DsdManCheckXY(p, Abc_Var2Lit(i, 0), LutSize, 0, 0, 0, 0) )
            continue;
        if ( fFast )
            Value = 0;
        else
        {
            pTruth = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
            Value = If_ManSatCheckXYall( pSat, LutSize, pTruth, nVars, vLits );
        }
        if ( Value )
            continue;
        If_DsdVecObjSetMark( &p->vObjs, i );
    }
    Extra_ProgressBarStop( pProgress );
    If_ManSatUnbuild( pSat );
    Vec_IntFree( vLits );
    if ( fVerbose )
        If_DsdManPrintDistrib( p );
}